

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

timestamp_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::QuantileDirect<duckdb::timestamp_t>>
          (Interpolator<false> *this,timestamp_t *v_t,Vector *result,
          QuantileDirect<duckdb::timestamp_t> *accessor)

{
  idx_t iVar1;
  timestamp_t tVar2;
  long lVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::timestamp_t>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::timestamp_t>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::timestamp_t>_>_> __comp_01;
  timestamp_t tVar4;
  bool bVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  timestamp_t result_1;
  string local_48;
  timestamp_t local_28;
  
  bVar5 = this->desc;
  iVar8 = this->CRN;
  iVar9 = this->FRN;
  iVar1 = this->begin;
  iVar7 = this->end;
  local_48._M_dataplus._M_p = (pointer)accessor;
  local_48._M_string_length = (size_type)accessor;
  local_48.field_2._M_local_buf[0] = bVar5;
  if (iVar8 == iVar9) {
    if (iVar8 != iVar7 && iVar1 != iVar7) {
      uVar6 = (long)(iVar7 * 8 + iVar1 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar5;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::timestamp_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::timestamp_t>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar7,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar8 = this->FRN;
    }
    tVar2.value = v_t[iVar8].value;
    bVar5 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2,&local_28,false);
    if (!bVar5) {
      auVar11 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)tVar2.value,(timestamp_t)auVar11._8_8_);
      InvalidInputException::InvalidInputException(auVar11._0_8_,(string *)&local_48);
      __cxa_throw(auVar11._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar9 != iVar7 && iVar1 != iVar7) {
      uVar6 = (long)(iVar7 * 8 + iVar1 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar5;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::timestamp_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::timestamp_t>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar7,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar9 = this->FRN;
      iVar8 = this->CRN;
      iVar7 = this->end;
    }
    local_48._M_dataplus._M_p = (pointer)accessor;
    local_48._M_string_length = (size_type)accessor;
    local_48.field_2._M_local_buf[0] = bVar5;
    if (iVar8 != iVar7 && iVar9 != iVar7) {
      uVar6 = (long)(iVar7 * 8 + iVar9 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar5;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::timestamp_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::timestamp_t>>>>
                (v_t + iVar9,v_t + iVar8,v_t + iVar7,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar9 = this->FRN;
    }
    tVar2.value = v_t[iVar9].value;
    bVar5 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2,&local_28,false);
    tVar4.value = local_28.value;
    if (!bVar5) {
      auVar11 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)tVar2.value,(timestamp_t)auVar11._8_8_);
      InvalidInputException::InvalidInputException(auVar11._0_8_,(string *)&local_48);
      __cxa_throw(auVar11._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    tVar2.value = v_t[this->CRN].value;
    bVar5 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2,&local_28,false);
    if (!bVar5) {
      auVar11 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)tVar2.value,(timestamp_t)auVar11._8_8_);
      InvalidInputException::InvalidInputException(auVar11._0_8_,(string *)&local_48);
      __cxa_throw(auVar11._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    dVar10 = this->RN -
             (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_28.value = llround(dVar10 * (double)local_28.value + (1.0 - dVar10) * (double)tVar4.value)
    ;
  }
  return (timestamp_t)local_28.value;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}